

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patternparser.cpp
# Opt level: O2

void __thiscall
PatternParser::parseFixedPattern
          (PatternParser *this,Pattern *pattern,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokenList)

{
  pointer pbVar1;
  InputError *pIVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  string *s1;
  string local_b8;
  string local_98;
  string local_78;
  _Alloc_hider local_58;
  double factor;
  allocator local_31;
  
  pbVar1 = (tokenList->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar5 = (uint)((ulong)((long)(tokenList->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) >> 5);
  if ((int)uVar5 < 2) {
    pIVar2 = (InputError *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&local_b8,"",(allocator *)&stack0xffffffffffffffa8);
    InputError::InputError(pIVar2,2,&local_b8);
    __cxa_throw(pIVar2,&InputError::typeinfo,ENerror::~ENerror);
  }
  std::__cxx11::string::string((string *)&stack0xffffffffffffffa8,"FIXED",&local_31);
  s1 = pbVar1 + 1;
  bVar3 = Utilities::match(s1,(string *)&stack0xffffffffffffffa8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  if (bVar3) {
    if (uVar5 != 2) {
      std::__cxx11::string::string((string *)&stack0xffffffffffffffa8,"",&local_31);
      iVar4 = Utilities::getSeconds(pbVar1 + 2,(string *)&stack0xffffffffffffffa8);
      if (iVar4 < 1) {
        pIVar2 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string((string *)&local_98,(string *)(pbVar1 + 2));
        InputError::InputError(pIVar2,7,&local_98);
        __cxa_throw(pIVar2,&InputError::typeinfo,ENerror::~ENerror);
      }
      pattern->interval = iVar4;
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
    }
  }
  else {
    uVar6 = (ulong)(uVar5 & 0x7fffffff);
    while (uVar6 = uVar6 - 1, uVar6 != 0) {
      bVar3 = Utilities::parseNumber<double>(s1,(double *)&stack0xffffffffffffffa8);
      if (!bVar3) {
        pIVar2 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string((string *)&local_78,(string *)s1);
        InputError::InputError(pIVar2,6,&local_78);
        __cxa_throw(pIVar2,&InputError::typeinfo,ENerror::~ENerror);
      }
      Pattern::addFactor(pattern,(double)local_58._M_p);
      s1 = s1 + 1;
    }
  }
  return;
}

Assistant:

void PatternParser::parseFixedPattern(Pattern* pattern, vector<string>& tokenList)
{
    // Formats are:
    //     PatternName  FIXED  (interval)
    //     PatternName  factor1  factor2  ...

    // ... check for enough tokens

    int nTokens = tokenList.size();
    if ( nTokens < 2 ) throw InputError(InputError::TOO_FEW_ITEMS, "");
    string* tokens = &tokenList[0];

    // ... cast pattern to FixedPattern

    FixedPattern* fixedPat = static_cast<FixedPattern*>(pattern);

    // ... check if next token is the pattern type keyword

    if ( Utilities::match(tokens[1], "FIXED") )
    {
        // check if next token is the pattern interval

        if ( nTokens > 2 )
        {
            string s2 = "";
            int interval = Utilities::getSeconds(tokens[2], s2);
            if ( interval <= 0 ) throw InputError(InputError::INVALID_TIME, tokens[2]);
            fixedPat->setTimeInterval(interval);

        }
        return;
    }

    // ... read in pattern factors

    double factor;
    int i = 1;
    while ( i < nTokens )
    {
        if ( !Utilities::parseNumber(tokens[i], factor) )
        {
            throw InputError(InputError::INVALID_NUMBER, tokens[i]);
        }
        fixedPat->addFactor(factor);
        i++;
    }
}